

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::SectionStats::~SectionStats(SectionStats *this)

{
  ~SectionStats(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

SectionStats::~SectionStats() {}